

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

void __thiscall
OpenMD::MoleculeCreator::createOverrideAtomTypes
          (MoleculeCreator *this,ForceField *ff,MoleculeStamp *molStamp)

{
  bool bVar1;
  int id;
  undefined8 uVar2;
  ForceField *pFVar3;
  AtomType *this_00;
  size_t sVar4;
  ForceField *in_RSI;
  char *__rhs;
  RealType charge;
  FixedChargeAdapter fca;
  int ident;
  AtomType *atomTypeOverride;
  AtomType *atB;
  string atomTypeOverrideName;
  ostringstream ss;
  RealType oc;
  string baseType;
  AtomType *atomType;
  size_t i;
  size_t nAtom;
  AtomStamp *stamp;
  AtomStamp *in_stack_fffffffffffffd08;
  ForceFieldOptions *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  AtomType *in_stack_fffffffffffffd48;
  ForceField *in_stack_fffffffffffffd50;
  FixedChargeAdapter in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  string local_288 [8];
  AtomType *in_stack_fffffffffffffd80;
  string local_268 [32];
  string local_248 [32];
  ostringstream local_228 [376];
  char *local_b0;
  string local_a8 [32];
  string local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  AtomType *local_38;
  ulong local_30;
  ulong local_28;
  AtomStamp *local_20;
  ForceField *local_10;
  
  local_10 = in_RSI;
  local_28 = MoleculeStamp::getNAtoms((MoleculeStamp *)0x1d3ddc);
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    local_20 = MoleculeStamp::getAtomStamp
                         ((MoleculeStamp *)in_stack_fffffffffffffd10,
                          (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    __rhs_00 = &local_58;
    pFVar3 = local_10;
    AtomStamp::getType_abi_cxx11_(in_stack_fffffffffffffd08);
    in_stack_fffffffffffffd48 =
         ForceField::getAtomType(in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48);
    std::__cxx11::string::~string((string *)&local_58);
    local_38 = in_stack_fffffffffffffd48;
    if (in_stack_fffffffffffffd48 == (AtomType *)0x0) {
      AtomStamp::getType_abi_cxx11_(in_stack_fffffffffffffd08);
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Can not find Matching Atom Type for[%s]",uVar2);
      std::__cxx11::string::~string(local_88);
      painCave.isFatal = 1;
      simError();
    }
    bVar1 = AtomStamp::hasOverride(local_20);
    if (bVar1) {
      AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffd08);
      __rhs = (char *)AtomStamp::getOverrideCharge(local_20);
      local_b0 = __rhs;
      std::__cxx11::ostringstream::ostringstream(local_228);
      std::ostream::operator<<(local_228,(double)local_b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3,
                     __rhs);
      std::__cxx11::ostringstream::str();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd48,__rhs_00);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_268);
      pFVar3 = (ForceField *)
               ForceField::getAtomType
                         (in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48);
      if (pFVar3 == (ForceField *)0x0) {
        this_00 = (AtomType *)operator_new(0xf8);
        AtomType::AtomType(in_stack_fffffffffffffd80);
        (*this_00->_vptr_AtomType[2])(this_00,local_38);
        sVar4 = ForceField::getNAtomType((ForceField *)0x1d406b);
        id = (int)sVar4;
        AtomType::setIdent(this_00,id);
        AtomType::setName((AtomType *)in_stack_fffffffffffffd10,(string *)in_stack_fffffffffffffd08)
        ;
        ForceField::addAtomType
                  (pFVar3,(string *)this_00,(AtomType *)CONCAT44(id,in_stack_fffffffffffffd60));
        FixedChargeAdapter::FixedChargeAdapter
                  ((FixedChargeAdapter *)&stack0xfffffffffffffd58,this_00);
        in_stack_fffffffffffffd10 = ForceField::getForceFieldOptions(local_10);
        in_stack_fffffffffffffd08 =
             (AtomStamp *)ForceFieldOptions::getChargeUnitScaling((ForceFieldOptions *)0x1d40ea);
        in_stack_fffffffffffffd50 =
             (ForceField *)((double)in_stack_fffffffffffffd08 * (double)local_b0);
        FixedChargeAdapter::makeFixedCharge
                  ((FixedChargeAdapter *)CONCAT44(id,in_stack_fffffffffffffd60),
                   (RealType)in_stack_fffffffffffffd58.at_);
      }
      std::__cxx11::string::~string(local_248);
      std::__cxx11::ostringstream::~ostringstream(local_228);
      std::__cxx11::string::~string(local_a8);
    }
  }
  return;
}

Assistant:

void MoleculeCreator::createOverrideAtomTypes(ForceField* ff,
						MoleculeStamp* molStamp) {

    // Some stamps have overrides of default types in the force field.
    // This runs through atomStamps which can have overrides and makes sure
    // that the types are created, even if this processor doesn't end up
    // owning that molecule:

    AtomStamp* stamp;
    size_t nAtom = molStamp->getNAtoms();
    
    for (size_t i = 0; i < nAtom; ++i) {
      stamp = molStamp->getAtomStamp(i);
      AtomType* atomType = ff->getAtomType(stamp->getType());
    
      if (atomType == NULL) {
	snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
		 "Can not find Matching Atom Type for[%s]",
		 stamp->getType().c_str());
	
	painCave.isFatal = 1;
	simError();
      }

      if (stamp->hasOverride()) {
	std::string baseType = atomType->getName();
	RealType oc          = stamp->getOverrideCharge();
	
	// Create a new atom type name that builds in the override charge:
	std::ostringstream ss;
	ss << oc;
	std::string atomTypeOverrideName = baseType + "_q=" + ss.str();
	
	// Maybe we've seen this before?
	
	AtomType* atB = ff->getAtomType(atomTypeOverrideName);
	
	if (atB == NULL) {
	  // Nope, we've never seen it before, so make a new one:
	  AtomType* atomTypeOverride = new AtomType();
	  // Base points to the atomType we already found
	  atomTypeOverride->useBase(atomType);
	  int ident = ff->getNAtomType();
	  atomTypeOverride->setIdent(ident);
	  atomTypeOverride->setName(atomTypeOverrideName);
	  ff->addAtomType(atomTypeOverrideName, atomTypeOverride);
	  FixedChargeAdapter fca = FixedChargeAdapter(atomTypeOverride);
	  RealType charge =
            ff->getForceFieldOptions().getChargeUnitScaling() * oc;
	  fca.makeFixedCharge(charge);
	} 
      }
    }    
  }